

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextBase.hpp
# Opt level: O0

bool __thiscall
Diligent::DeviceContextBase<Diligent::EngineGLImplTraits>::CheckIfBoundAsRenderTarget
          (DeviceContextBase<Diligent::EngineGLImplTraits> *this,TextureImplType *pTexture)

{
  bool bVar1;
  TextureViewGLImpl *this_00;
  TextureImplType *pTVar2;
  uint local_24;
  Uint32 rt;
  TextureImplType *pTexture_local;
  DeviceContextBase<Diligent::EngineGLImplTraits> *this_local;
  
  if (pTexture != (TextureImplType *)0x0) {
    for (local_24 = 0; local_24 < this->m_NumBoundRenderTargets; local_24 = local_24 + 1) {
      bVar1 = Diligent::RefCntAutoPtr::operator_cast_to_bool
                        ((RefCntAutoPtr *)(this->m_pBoundRenderTargets + local_24));
      if (bVar1) {
        this_00 = RefCntAutoPtr<Diligent::TextureViewGLImpl>::operator->
                            (this->m_pBoundRenderTargets + local_24);
        pTVar2 = (TextureImplType *)
                 TextureViewBase<Diligent::EngineGLImplTraits>::GetTexture
                           (&this_00->super_TextureViewBase<Diligent::EngineGLImplTraits>);
        if (pTVar2 == pTexture) {
          return true;
        }
      }
    }
  }
  return false;
}

Assistant:

bool DeviceContextBase<ImplementationTraits>::CheckIfBoundAsRenderTarget(TextureImplType* pTexture)
{
    if (pTexture == nullptr)
        return false;

    for (Uint32 rt = 0; rt < m_NumBoundRenderTargets; ++rt)
    {
        if (m_pBoundRenderTargets[rt] && m_pBoundRenderTargets[rt]->GetTexture() == pTexture)
        {
            return true;
        }
    }

    return false;
}